

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O2

void open_cb(Fl_Widget *param_1,void *v)

{
  int iVar1;
  char *c;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  Fl_Native_File_Chooser fnfc;
  
  if ((v == (void *)0x0) && (modflag != 0)) {
    pcVar4 = "Do you want to save changes to this user\ninterface before opening another one?";
    iVar1 = fl_choice("Do you want to save changes to this user\ninterface before opening another one?"
                      ,"Cancel","Save","Don\'t Save");
    if (iVar1 == 0) {
      return;
    }
    if ((iVar1 == 1) && (save_cb((Fl_Widget *)pcVar4,(void *)0x0), modflag != 0)) {
      return;
    }
  }
  Fl_Native_File_Chooser::Fl_Native_File_Chooser(&fnfc,0);
  Fl_Native_File_Chooser::title(&fnfc,"Open:");
  Fl_Native_File_Chooser::type(&fnfc,0);
  Fl_Native_File_Chooser::filter(&fnfc,"FLUID Files\t*.f[ld]\n");
  iVar1 = Fl_Native_File_Chooser::show(&fnfc);
  if (iVar1 == 0) {
    c = Fl_Native_File_Chooser::filename(&fnfc);
    pcVar4 = filename;
    filename = (char *)0x0;
    set_filename(c);
    if (v != (void *)0x0) {
      undo_checkpoint();
    }
    undo_suspend();
    iVar1 = read_file(c,(uint)(v != (void *)0x0));
    if (iVar1 == 0) {
      undo_resume();
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fl_message("Can\'t read %s: %s",c,pcVar3);
      free(filename);
      iVar1 = modflag;
      filename = pcVar4;
      if (main_window == (Fl_Window *)0x0) goto LAB_00199e24;
    }
    else {
      undo_resume();
      if (v == (void *)0x0) {
        set_modflag(0);
        undo_clear();
        free(pcVar4);
        goto LAB_00199e24;
      }
      free(filename);
      iVar1 = 1;
    }
    filename = pcVar4;
    set_modflag(iVar1);
  }
LAB_00199e24:
  Fl_Native_File_Chooser::~Fl_Native_File_Chooser(&fnfc);
  return;
}

Assistant:

void open_cb(Fl_Widget *, void *v) {
  if (!v && modflag) {
    switch (fl_choice("Do you want to save changes to this user\n"
                      "interface before opening another one?", "Cancel",
                      "Save", "Don't Save"))
    {
      case 0 : /* Cancel */
          return;
      case 1 : /* Save */
          save_cb(NULL, NULL);
	  if (modflag) return;	// Didn't save!
    }
  }
  const char *c;
  const char *oldfilename;
  Fl_Native_File_Chooser fnfc;
  fnfc.title("Open:");
  fnfc.type(Fl_Native_File_Chooser::BROWSE_FILE);
  fnfc.filter("FLUID Files\t*.f[ld]\n");
  if (fnfc.show() != 0) return;
  c = fnfc.filename();
  oldfilename = filename;
  filename    = NULL;
  set_filename(c);
  if (v != 0) undo_checkpoint();
  undo_suspend();
  if (!read_file(c, v!=0)) {
    undo_resume();
    fl_message("Can't read %s: %s", c, strerror(errno));
    free((void *)filename);
    filename = oldfilename;
    if (main_window) set_modflag(modflag);
    return;
  }
  undo_resume();
  if (v) {
    // Inserting a file; restore the original filename...
    free((void *)filename);
    filename = oldfilename;
    set_modflag(1);
  } else {
    // Loaded a file; free the old filename...
    set_modflag(0);
    undo_clear();
    if (oldfilename) free((void *)oldfilename);
  }
}